

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O3

int run_test_fs_poll_close_request_stop_when_active(void)

{
  int iVar1;
  int extraout_EAX;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  long local_378 [9];
  undefined1 local_330 [808];
  
  remove("testfile");
  iVar1 = uv_loop_init(local_330);
  local_378[0] = (long)iVar1;
  if (local_378[0] == 0) {
    iVar1 = uv_fs_poll_init(local_330,local_378);
    if (iVar1 != 0) goto LAB_0018b363;
    iVar1 = uv_fs_poll_start(local_378,poll_cb_noop,"testfile",100);
    if (iVar1 != 0) goto LAB_0018b370;
    uv_run(local_330,1);
    iVar1 = uv_fs_poll_stop(local_378);
    if (iVar1 != 0) goto LAB_0018b37d;
    uv_run(local_330,1);
    uv_close(local_378,close_cb);
    uv_run(local_330,1);
    if (close_cb_called == 1) {
      uv_walk(local_330,close_walk_cb,0);
      uv_run(local_330,0);
      iVar1 = uv_loop_close(local_330);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018b397;
    }
  }
  else {
    run_test_fs_poll_close_request_stop_when_active_cold_1();
LAB_0018b363:
    run_test_fs_poll_close_request_stop_when_active_cold_2();
LAB_0018b370:
    run_test_fs_poll_close_request_stop_when_active_cold_3();
LAB_0018b37d:
    run_test_fs_poll_close_request_stop_when_active_cold_4();
  }
  run_test_fs_poll_close_request_stop_when_active_cold_5();
LAB_0018b397:
  run_test_fs_poll_close_request_stop_when_active_cold_6();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_close_request_stop_when_active) {
  /* Regression test for https://github.com/libuv/libuv/issues/2287. */
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;

  remove(FIXTURE);

  ASSERT_OK(uv_loop_init(&loop));

  /* Set up all handles. */
  ASSERT_OK(uv_fs_poll_init(&loop, &poll_handle));
  ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_noop, FIXTURE, 100));
  uv_run(&loop, UV_RUN_ONCE);

  /* Close the timer handle, and do not crash. */
  ASSERT_OK(uv_fs_poll_stop(&poll_handle));
  uv_run(&loop, UV_RUN_ONCE);

  /* Clean up after the test. */
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  uv_run(&loop, UV_RUN_ONCE);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}